

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiPhraseFirst(Fts5Context *pCtx,int iPhrase,Fts5PhraseIter *pIter,int *piCol,int *piOff)

{
  int iVar1;
  int local_3c;
  int rc;
  int n;
  Fts5Cursor *pCsr;
  int *piOff_local;
  int *piCol_local;
  Fts5PhraseIter *pIter_local;
  Fts5Context *pFStack_10;
  int iPhrase_local;
  Fts5Context *pCtx_local;
  
  _rc = pCtx;
  pCsr = (Fts5Cursor *)piOff;
  piOff_local = piCol;
  piCol_local = (int *)pIter;
  pIter_local._4_4_ = iPhrase;
  pFStack_10 = pCtx;
  iVar1 = fts5CsrPoslist((Fts5Cursor *)pCtx,iPhrase,&pIter->a,&local_3c);
  if (iVar1 == 0) {
    *(long *)(piCol_local + 2) = *(long *)piCol_local + (long)local_3c;
    *piOff_local = 0;
    *(undefined4 *)&(pCsr->base).pVtab = 0;
    fts5ApiPhraseNext(pFStack_10,(Fts5PhraseIter *)piCol_local,piOff_local,(int *)pCsr);
  }
  return iVar1;
}

Assistant:

static int fts5ApiPhraseFirst(
  Fts5Context *pCtx, 
  int iPhrase, 
  Fts5PhraseIter *pIter, 
  int *piCol, int *piOff
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int n;
  int rc = fts5CsrPoslist(pCsr, iPhrase, &pIter->a, &n);
  if( rc==SQLITE_OK ){
    pIter->b = &pIter->a[n];
    *piCol = 0;
    *piOff = 0;
    fts5ApiPhraseNext(pCtx, pIter, piCol, piOff);
  }
  return rc;
}